

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalOrder::GetData
          (PhysicalOrder *this,ExecutionContext *context,DataChunk *chunk,OperatorSourceInput *input
          )

{
  __uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *this_00;
  GlobalSourceState *pGVar1;
  _func_int **pp_Var2;
  GlobalSourceState *pGVar3;
  LocalSourceState *pLVar4;
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> __p;
  pointer pPVar5;
  idx_t iVar6;
  pointer pGVar7;
  bool bVar8;
  bool local_39;
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> local_38;
  
  pGVar3 = input->global_state;
  pLVar4 = input->local_state;
  this_00 = (__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *
            )(pLVar4 + 2);
  if (pLVar4[2]._vptr_LocalSourceState != (_func_int **)0x0) {
    pPVar5 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
             operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                         *)this_00);
    iVar6 = PayloadScanner::Remaining(pPVar5);
    if (iVar6 == 0) {
      LOCK();
      pGVar1 = pGVar3 + 1;
      pp_Var2 = pGVar1->_vptr_GlobalSourceState;
      pGVar1->_vptr_GlobalSourceState = (_func_int **)((long)pGVar1->_vptr_GlobalSourceState + 1);
      UNLOCK();
      pLVar4[1]._vptr_LocalSourceState = pp_Var2;
      local_38._M_head_impl = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
      reset(this_00,(pointer)0x0);
      ::std::unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
      ~unique_ptr((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
                   *)&local_38);
    }
  }
  bVar8 = true;
  if (pLVar4[1]._vptr_LocalSourceState < *(_func_int ***)&pGVar3[1].super_StateWithBlockableTasks) {
    if ((this_00->_M_t).
        super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
        .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl ==
        (PayloadScanner *)0x0) {
      pGVar7 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
               ::operator->(&(this->super_PhysicalOperator).sink_state);
      local_39 = true;
      make_uniq<duckdb::PayloadScanner,duckdb::GlobalSortState&,unsigned_long&,bool>
                ((duckdb *)&local_38,(GlobalSortState *)&pGVar7[1].super_StateWithBlockableTasks,
                 (unsigned_long *)(pLVar4 + 1),&local_39);
      __p._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
      reset(this_00,__p._M_head_impl);
      ::std::unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
      ~unique_ptr((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
                   *)&local_38);
    }
    pPVar5 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
             operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                         *)this_00);
    PayloadScanner::Scan(pPVar5,chunk);
    bVar8 = chunk->count == 0;
  }
  return bVar8;
}

Assistant:

SourceResultType PhysicalOrder::GetData(ExecutionContext &context, DataChunk &chunk, OperatorSourceInput &input) const {
	auto &gstate = input.global_state.Cast<PhysicalOrderGlobalSourceState>();
	auto &lstate = input.local_state.Cast<PhysicalOrderLocalSourceState>();

	if (lstate.scanner && lstate.scanner->Remaining() == 0) {
		lstate.batch_index = gstate.next_batch_index++;
		lstate.scanner = nullptr;
	}

	if (lstate.batch_index >= gstate.total_batches) {
		return SourceResultType::FINISHED;
	}

	if (!lstate.scanner) {
		auto &sink = this->sink_state->Cast<OrderGlobalSinkState>();
		auto &global_sort_state = sink.global_sort_state;
		lstate.scanner = make_uniq<PayloadScanner>(global_sort_state, lstate.batch_index, true);
	}

	lstate.scanner->Scan(chunk);

	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}